

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShmSystemV.cpp
# Opt level: O1

void __thiscall adios2::transport::ShmSystemV::~ShmSystemV(ShmSystemV *this)

{
  pointer pcVar1;
  
  (this->super_Transport)._vptr_Transport = (_func_int **)&PTR__ShmSystemV_00886a60;
  if ((this->super_Transport).m_IsOpen == true) {
    shmdt(this->m_Buffer);
    if (this->m_RemoveAtClose == true) {
      shmctl(this->m_ShmID,0,(shmid_ds *)0x0);
    }
  }
  pcVar1 = (this->m_PathName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_PathName).field_2) {
    operator_delete(pcVar1);
  }
  Transport::~Transport(&this->super_Transport);
  return;
}

Assistant:

ShmSystemV::~ShmSystemV() // this might not be correct
{
    if (m_IsOpen)
    {
        shmdt(m_Buffer);

        if (m_RemoveAtClose)
        {
            shmctl(m_ShmID, IPC_RMID, NULL);
        }
    }
}